

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O1

aiVectorKey * __thiscall
comparer_context::cmp<aiVectorKey>
          (aiVectorKey *__return_storage_ptr__,comparer_context *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 extraout_XMM0_Qb;
  aiVector3D aVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_68;
  float local_44;
  double local_40;
  undefined1 local_38 [16];
  
  paVar1 = &local_68.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_68);
  local_40 = cmp<double>(this,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (name->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_68);
  aVar3 = cmp<aiVector3t<float>>(this,&local_68);
  local_44 = aVar3.z;
  local_38._0_4_ = aVar3.x;
  local_38._4_4_ = aVar3.y;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    local_38._8_4_ = (int)extraout_XMM0_Qb;
    local_38._0_8_ = aVar3._0_8_;
    local_38._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  __return_storage_ptr__->mTime = local_40;
  (__return_storage_ptr__->mValue).x = (float)local_38._0_4_;
  (__return_storage_ptr__->mValue).y = (float)local_38._4_4_;
  (__return_storage_ptr__->mValue).z = local_44;
  return __return_storage_ptr__;
}

Assistant:

aiVectorKey comparer_context :: cmp<aiVectorKey >(const std::string& name)
{
    const double mTime = cmp<double>(name+".mTime");
    const aiVector3D mValue = cmp<aiVector3D>(name+".mValue");

    return aiVectorKey(mTime,mValue);
}